

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int parse_esni_keys(ptls_context_t *ctx,ptls_key_exchange_algorithm_t **selected_key_share,
                   ptls_cipher_suite_t **selected_cipher,ptls_iovec_t *peer_key,
                   uint16_t *padded_length,ptls_iovec_t input)

{
  int iVar1;
  ptls_hash_context_t *ppVar2;
  ulong uVar3;
  uint8_t *puVar4;
  uint8_t *end_4;
  size_t _block_size_3;
  size_t _capacity_3;
  uint8_t *puStack_e0;
  uint16_t id;
  uint8_t *end_3;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  uint8_t digest [32];
  ptls_hash_context_t *hctx;
  int ret;
  uint64_t now;
  uint64_t not_after;
  uint64_t not_before;
  uint8_t *puStack_40;
  uint16_t version;
  uint8_t *end;
  uint8_t *src;
  uint16_t *padded_length_local;
  ptls_iovec_t *peer_key_local;
  ptls_cipher_suite_t **selected_cipher_local;
  ptls_key_exchange_algorithm_t **selected_key_share_local;
  ptls_context_t *ctx_local;
  
  end = input.base;
  puStack_40 = input.base + input.len;
  src = (uint8_t *)padded_length;
  padded_length_local = (uint16_t *)peer_key;
  peer_key_local = (ptls_iovec_t *)selected_cipher;
  selected_cipher_local = (ptls_cipher_suite_t **)selected_key_share;
  selected_key_share_local = (ptls_key_exchange_algorithm_t **)ctx;
  hctx._4_4_ = ptls_decode16((uint16_t *)((long)&not_before + 6),&end,puStack_40);
  if (hctx._4_4_ == 0) {
    if (not_before._6_2_ == -0xff) {
      if ((long)puStack_40 - (long)end < 4) {
        hctx._4_4_ = 0x32;
      }
      else {
        ppVar2 = create_sha256_context((ptls_context_t *)selected_key_share_local);
        if (ppVar2 == (ptls_hash_context_t *)0x0) {
          hctx._4_4_ = 0x203;
        }
        else {
          (*ppVar2->update)(ppVar2,input.base,(long)end - (long)input.base);
          (*ppVar2->update)(ppVar2,"",4);
          (*ppVar2->update)(ppVar2,end + 4,(long)puStack_40 - (long)(end + 4));
          (*ppVar2->final)(ppVar2,&_capacity,PTLS_HASH_FINAL_MODE_FREE);
          if (*(int *)end == (int)_capacity) {
            _block_size = 2;
            if ((ulong)((long)puStack_40 - (long)(end + 4)) < 2) {
              hctx._4_4_ = 0x32;
            }
            else {
              end_1 = (uint8_t *)0x0;
              end = end + 4;
              do {
                puVar4 = end + 1;
                end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end);
                _block_size = _block_size - 1;
                end = puVar4;
              } while (_block_size != 0);
              if (puStack_40 + -(long)puVar4 < end_1) {
                hctx._4_4_ = 0x32;
              }
              else {
                _capacity_1 = (size_t)(puVar4 + (long)end_1);
                hctx._4_4_ = select_key_share((ptls_key_exchange_algorithm_t **)
                                              selected_cipher_local,
                                              (ptls_iovec_t *)padded_length_local,
                                              (ptls_key_exchange_algorithm_t **)
                                              selected_key_share_local[2],&end,
                                              (uint8_t *)_capacity_1,0);
                if (hctx._4_4_ == 0) {
                  if (end == (uint8_t *)_capacity_1) {
                    _block_size_1 = 2;
                    if ((ulong)((long)puStack_40 - (long)end) < 2) {
                      hctx._4_4_ = 0x32;
                    }
                    else {
                      end_2 = (uint8_t *)0x0;
                      do {
                        puVar4 = end + 1;
                        end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*end);
                        _block_size_1 = _block_size_1 - 1;
                        end = puVar4;
                      } while (_block_size_1 != 0);
                      if (puStack_40 + -(long)puVar4 < end_2) {
                        hctx._4_4_ = 0x32;
                      }
                      else {
                        _capacity_2 = (size_t)(puVar4 + (long)end_2);
                        hctx._4_4_ = select_cipher((ptls_cipher_suite_t **)peer_key_local,
                                                   (ptls_cipher_suite_t **)
                                                   selected_key_share_local[3],puVar4,
                                                   (uint8_t *)_capacity_2);
                        if (hctx._4_4_ == 0) {
                          end = (uint8_t *)_capacity_2;
                          hctx._4_4_ = ptls_decode16((uint16_t *)src,&end,puStack_40);
                          if ((((hctx._4_4_ == 0) && (src != (uint8_t *)0x0)) &&
                              (hctx._4_4_ = ptls_decode64(&not_after,&end,puStack_40),
                              hctx._4_4_ == 0)) &&
                             (hctx._4_4_ = ptls_decode64(&now,&end,puStack_40), hctx._4_4_ == 0)) {
                            _block_size_2 = 2;
                            if ((ulong)((long)puStack_40 - (long)end) < 2) {
                              hctx._4_4_ = 0x32;
                            }
                            else {
                              end_3 = (uint8_t *)0x0;
                              do {
                                puStack_e0 = end + 1;
                                end_3 = (uint8_t *)((long)end_3 << 8 | (ulong)*end);
                                _block_size_2 = _block_size_2 - 1;
                                end = puStack_e0;
                              } while (_block_size_2 != 0);
                              _block_size_2 = 0;
                              if (puStack_40 + -(long)puStack_e0 < end_3) {
                                hctx._4_4_ = 0x32;
                              }
                              else {
                                puStack_e0 = puStack_e0 + (long)end_3;
                                while (end != puStack_e0) {
                                  iVar1 = ptls_decode16((uint16_t *)((long)&_capacity_3 + 6),&end,
                                                        puStack_e0);
                                  if (iVar1 != 0) {
                                    return iVar1;
                                  }
                                  _block_size_3 = 2;
                                  if ((ulong)((long)puStack_e0 - (long)end) < 2) {
                                    return 0x32;
                                  }
                                  end_4 = (uint8_t *)0x0;
                                  do {
                                    puVar4 = end + 1;
                                    end_4 = (uint8_t *)((long)end_4 << 8 | (ulong)*end);
                                    _block_size_3 = _block_size_3 - 1;
                                    end = puVar4;
                                  } while (_block_size_3 != 0);
                                  if (puStack_e0 + -(long)puVar4 < end_4) {
                                    return 0x32;
                                  }
                                  end = puVar4 + (long)end_4;
                                }
                                if (end == puStack_e0) {
                                  if (end == puStack_40) {
                                    uVar3 = (**(code **)selected_key_share_local[1])
                                                      (selected_key_share_local[1]);
                                    if ((uVar3 / 1000 < not_after) || (now < uVar3 / 1000)) {
                                      hctx._4_4_ = 0x32;
                                    }
                                    else {
                                      hctx._4_4_ = 0;
                                    }
                                  }
                                  else {
                                    hctx._4_4_ = 0x32;
                                  }
                                }
                                else {
                                  hctx._4_4_ = 0x32;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    hctx._4_4_ = 0x32;
                  }
                }
              }
            }
          }
          else {
            hctx._4_4_ = 0x32;
          }
        }
      }
    }
    else {
      hctx._4_4_ = 0x32;
    }
  }
  return hctx._4_4_;
}

Assistant:

static int parse_esni_keys(ptls_context_t *ctx, ptls_key_exchange_algorithm_t **selected_key_share,
                           ptls_cipher_suite_t **selected_cipher, ptls_iovec_t *peer_key, uint16_t *padded_length,
                           ptls_iovec_t input)
{
    const uint8_t *src = input.base, *const end = input.base + input.len;
    uint16_t version;
    uint64_t not_before, not_after, now;
    int ret = 0;

    /* version */
    if ((ret = ptls_decode16(&version, &src, end)) != 0)
        goto Exit;
    if (version != PTLS_ESNI_VERSION_DRAFT02) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }

    { /* verify checksum */
        ptls_hash_context_t *hctx;
        uint8_t digest[PTLS_SHA256_DIGEST_SIZE];
        if (end - src < 4) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        if ((hctx = create_sha256_context(ctx)) == NULL) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        hctx->update(hctx, input.base, src - input.base);
        hctx->update(hctx, "\0\0\0\0", 4);
        hctx->update(hctx, src + 4, end - (src + 4));
        hctx->final(hctx, digest, PTLS_HASH_FINAL_MODE_FREE);
        if (memcmp(src, digest, 4) != 0) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        src += 4;
    }
    /* key-shares */
    ptls_decode_open_block(src, end, 2, {
        if ((ret = select_key_share(selected_key_share, peer_key, ctx->key_exchanges, &src, end, 0)) != 0)
            goto Exit;
    });
    /* cipher-suite */
    ptls_decode_open_block(src, end, 2, {
        if ((ret = select_cipher(selected_cipher, ctx->cipher_suites, src, end)) != 0)
            goto Exit;
        src = end;
    });
    /* padded-length */
    if ((ret = ptls_decode16(padded_length, &src, end)) != 0)
        goto Exit;
    if (padded_length == 0)
        goto Exit;
    /* not-before, not_after */
    if ((ret = ptls_decode64(&not_before, &src, end)) != 0 || (ret = ptls_decode64(&not_after, &src, end)) != 0)
        goto Exit;
    /* extensions */
    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
        }
    });

    /* check validity period */
    now = ctx->get_time->cb(ctx->get_time) / 1000;
    if (!(not_before <= now && now <= not_after)) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }

    ret = 0;
Exit:
    return ret;
}